

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O1

UBool icu_63::PatternProps::isIdentifier(UChar *s,int32_t length)

{
  UChar *pUVar1;
  UBool UVar2;
  
  if (length < 1) {
    return '\0';
  }
  pUVar1 = s + (uint)length;
  do {
    UVar2 = isSyntaxOrWhiteSpace((uint)(ushort)*s);
    if (UVar2 != '\0') {
      return '\0';
    }
    s = s + 1;
  } while (s < pUVar1);
  return '\x01';
}

Assistant:

UBool
PatternProps::isIdentifier(const UChar *s, int32_t length) {
    if(length<=0) {
        return FALSE;
    }
    const UChar *limit=s+length;
    do {
        if(isSyntaxOrWhiteSpace(*s++)) {
            return FALSE;
        }
    } while(s<limit);
    return TRUE;
}